

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatsFactoryImpl.cpp
# Opt level: O1

unique_ptr<jaegertracing::metrics::Timer,_std::default_delete<jaegertracing::metrics::Timer>_>
__thiscall
jaegertracing::metrics::StatsFactoryImpl::createTimer
          (StatsFactoryImpl *this,string *name,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *tags)

{
  _func_int **pp_Var1;
  Metric *this_00;
  TagMap *in_RCX;
  
  this_00 = (Metric *)operator_new(0x70);
  pp_Var1 = (_func_int **)name->_M_string_length;
  Metric::Metric(this_00,(string *)tags,in_RCX);
  this_00[1]._vptr_Metric = pp_Var1;
  this_00->_vptr_Metric = (_func_int **)&PTR__TimerImpl_00275990;
  this_00[1]._name._M_dataplus._M_p = (pointer)&PTR__TimerImpl_002759b8;
  (this->super_StatsFactory)._vptr_StatsFactory = (_func_int **)&this_00[1]._name;
  return (__uniq_ptr_data<jaegertracing::metrics::Timer,_std::default_delete<jaegertracing::metrics::Timer>,_true,_true>
          )(__uniq_ptr_data<jaegertracing::metrics::Timer,_std::default_delete<jaegertracing::metrics::Timer>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Timer> StatsFactoryImpl::createTimer(
    const std::string& name,
    const std::unordered_map<std::string, std::string>& tags)
{
    return std::unique_ptr<Timer>(new TimerImpl(_reporter, name, tags));
}